

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

SequenceRepeatLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_sequencerepeat
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x154) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x154;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.sequencerepeat_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::SequenceRepeatLayerParams>(arena);
    (this->layer_).sequencerepeat_ = (SequenceRepeatLayerParams *)LVar2;
  }
  return (SequenceRepeatLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::SequenceRepeatLayerParams* NeuralNetworkLayer::_internal_mutable_sequencerepeat() {
  if (!_internal_has_sequencerepeat()) {
    clear_layer();
    set_has_sequencerepeat();
    layer_.sequencerepeat_ = CreateMaybeMessage< ::CoreML::Specification::SequenceRepeatLayerParams >(GetArenaForAllocation());
  }
  return layer_.sequencerepeat_;
}